

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbdCut2.c
# Opt level: O1

int Sbd_ManCutReduceTop(Gia_Man_t *p,Vec_Int_t *vMirrors,int iObj,Vec_Int_t *vLutLevs,
                       Vec_Int_t *vCut,Vec_Int_t *vCutTop,int nCutSize)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  int *piVar4;
  uint Entry;
  long lVar5;
  long lVar6;
  ulong uVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  int *piVar12;
  uint uVar13;
  bool bVar14;
  
  if ((iObj < 0) || (vLutLevs->nSize <= iObj)) {
LAB_0053de8e:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                  ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  iVar8 = vLutLevs->pArray[(uint)iObj];
  Vec_IntIsOrdered(vCut);
  if ((long)vCutTop->nSize < 1) {
    return 0;
  }
  iVar8 = iVar8 + -2;
  lVar6 = (long)vCutTop->nSize + 1;
  do {
    iVar1 = vCutTop->pArray[lVar6 + -2];
    lVar5 = (long)iVar1;
    if ((lVar5 < 0) || (p->nObjs <= iVar1)) {
      __assert_fail("v >= 0 && v < p->nObjs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                    ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
    }
    uVar10 = (uint)*(undefined8 *)(p->pObjs + lVar5);
    if ((~uVar10 & 0x9fffffff) != 0) {
      if (((int)uVar10 < 0) || ((uVar10 & 0x1fffffff) == 0x1fffffff)) {
        __assert_fail("Gia_ObjIsAnd(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sbd/sbdCut2.c"
                      ,0x114,
                      "int Sbd_ManCutReduceTop(Gia_Man_t *, Vec_Int_t *, int, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, int)"
                     );
      }
      iVar2 = vLutLevs->nSize;
      if (iVar2 <= iVar1) goto LAB_0053de8e;
      piVar12 = vLutLevs->pArray;
      if (piVar12[lVar5] != iVar8) {
        __assert_fail("Vec_IntEntry(vLutLevs, Entry) == LevStop",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sbd/sbdCut2.c"
                      ,0x115,
                      "int Sbd_ManCutReduceTop(Gia_Man_t *, Vec_Int_t *, int, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, int)"
                     );
      }
      uVar10 = iVar1 - (uVar10 & 0x1fffffff);
      if (((((int)uVar10 < 0) || (vMirrors->nSize <= (int)uVar10)) ||
          (uVar13 = iVar1 - ((uint)((ulong)*(undefined8 *)(p->pObjs + lVar5) >> 0x20) & 0x1fffffff),
          (int)uVar13 < 0)) || (vMirrors->nSize <= (int)uVar13)) goto LAB_0053de8e;
      uVar9 = vMirrors->pArray[uVar10];
      uVar3 = vMirrors->pArray[uVar13];
      Entry = uVar9 >> 1;
      if ((int)uVar9 < 0) {
        Entry = uVar10;
      }
      uVar10 = uVar3 >> 1;
      if ((int)uVar3 < 0) {
        uVar10 = uVar13;
      }
      if (((int)Entry < 0) || (iVar2 <= (int)Entry)) goto LAB_0053de8e;
      if (piVar12[Entry] <= iVar8) {
        if (((int)uVar10 < 0) || (iVar2 <= (int)uVar10)) goto LAB_0053de8e;
        if ((piVar12[uVar10] <= iVar8) && ((piVar12[Entry] != iVar8 || (piVar12[uVar10] != iVar8))))
        {
          uVar13 = vCut->nSize;
          uVar7 = 0;
          bVar14 = 0 < (int)uVar13;
          if ((int)uVar13 < 1) goto LAB_0053dddf;
          bVar14 = true;
          if (*vCut->pArray == iVar1) goto LAB_0053dddf;
          uVar11 = 0;
          break;
        }
      }
    }
    lVar6 = lVar6 + -1;
    if (lVar6 < 2) {
      return 0;
    }
  } while( true );
  while (uVar7 = uVar11 + 1, lVar6 = uVar11 + 1, uVar11 = uVar7, vCut->pArray[lVar6] != iVar1) {
    if ((ulong)uVar13 - 1 == uVar11) {
      bVar14 = false;
      uVar7 = (ulong)uVar13;
      goto LAB_0053dddf;
    }
  }
  bVar14 = uVar7 < uVar13;
LAB_0053dddf:
  if ((uint)uVar7 != uVar13) {
    if (!bVar14) {
      __assert_fail("i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,999,"int Vec_IntRemove(Vec_Int_t *, int)");
    }
    uVar9 = (uint)uVar7 + 1;
    if ((int)uVar9 < (int)uVar13) {
      piVar4 = vCut->pArray;
      piVar12 = piVar4 + uVar9;
      do {
        iVar8 = (int)uVar7;
        piVar4[uVar7 & 0xffffffff] = *piVar12;
        uVar13 = vCut->nSize;
        piVar12 = piVar12 + 1;
        uVar7 = (ulong)(iVar8 + 1);
      } while (iVar8 + 2 < (int)uVar13);
    }
    vCut->nSize = uVar13 - 1;
  }
  if (Entry != 0) {
    if (0 < (long)vCut->nSize) {
      lVar6 = 0;
      do {
        if (vCut->pArray[lVar6] == Entry) goto LAB_0053de4d;
        lVar6 = lVar6 + 1;
      } while (vCut->nSize != lVar6);
    }
    Vec_IntPushOrder(vCut,Entry);
  }
LAB_0053de4d:
  if (uVar10 != 0) {
    if (0 < (long)vCut->nSize) {
      lVar6 = 0;
      do {
        if (vCut->pArray[lVar6] == uVar10) {
          return 1;
        }
        lVar6 = lVar6 + 1;
      } while (vCut->nSize != lVar6);
    }
    Vec_IntPushOrder(vCut,uVar10);
  }
  return 1;
}

Assistant:

int Sbd_ManCutReduceTop( Gia_Man_t * p, Vec_Int_t * vMirrors, int iObj, Vec_Int_t * vLutLevs, Vec_Int_t * vCut, Vec_Int_t * vCutTop, int nCutSize )
{
    int i, Entry, Lit0m, Lit1m, Fan0, Fan1;
    int LevStop = Vec_IntEntry(vLutLevs, iObj) - 2;
    Vec_IntIsOrdered( vCut );
    Vec_IntForEachEntryReverse( vCutTop, Entry, i )
    {
        Gia_Obj_t * pObj = Gia_ManObj( p, Entry );
        if ( Gia_ObjIsCi(pObj) )
            continue;
        assert( Gia_ObjIsAnd(pObj) );
        assert( Vec_IntEntry(vLutLevs, Entry) == LevStop );
        Lit0m = Vec_IntEntry( vMirrors, Gia_ObjFaninId0(pObj, Entry) );
        Lit1m = Vec_IntEntry( vMirrors, Gia_ObjFaninId1(pObj, Entry) );
        Fan0 = Lit0m >= 0 ? Abc_Lit2Var(Lit0m) : Gia_ObjFaninId0(pObj, Entry);
        Fan1 = Lit1m >= 0 ? Abc_Lit2Var(Lit1m) : Gia_ObjFaninId1(pObj, Entry);
        if ( Vec_IntEntry(vLutLevs, Fan0) > LevStop || Vec_IntEntry(vLutLevs, Fan1) > LevStop )
            continue;
        assert( Vec_IntEntry(vLutLevs, Fan0) <= LevStop );
        assert( Vec_IntEntry(vLutLevs, Fan1) <= LevStop );
        if ( Vec_IntEntry(vLutLevs, Fan0) == LevStop && Vec_IntEntry(vLutLevs, Fan1) == LevStop )
            continue;
        Vec_IntRemove( vCut, Entry );
        if ( Fan0 ) Vec_IntPushUniqueOrder( vCut, Fan0 );
        if ( Fan1 ) Vec_IntPushUniqueOrder( vCut, Fan1 );
        //Sbd_ManCutIsTopo( p, vMirrors, vCut, iObj );
        return 1;
    }
    return 0;
}